

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Request * __thiscall
kj::anon_unknown_36::HttpClientAdapter::request
          (Request *__return_storage_ptr__,HttpClientAdapter *this,HttpMethod method,StringPtr url,
          HttpHeaders *headers,Maybe<unsigned_long> *expectedBodySize)

{
  PromiseArena *pPVar1;
  PromiseArenaMember *node;
  SourceLocation location;
  OwnPromiseNode OVar2;
  PromiseBase PVar3;
  size_t sVar4;
  Request *pRVar5;
  StringPtr *pSVar6;
  ArrayDisposer *pAVar7;
  WeakFulfiller<kj::HttpClient::Response> *pWVar8;
  PromiseArena *pPVar9;
  void *pvVar10;
  int __flags;
  HttpHeaders *pHVar12;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar13;
  void *__arg;
  TransformPromiseNodeBase *this_00;
  Promise<void> promise;
  Own<kj::HttpHeaders,_std::nullptr_t> headersCopy;
  PromiseFulfillerPair<kj::HttpClient::Response> paf;
  PromiseFulfillerPair<kj::Promise<void>_> requestPaf;
  String urlCopy;
  Refcounted *refcounted;
  OneWayPipe pipe;
  OwnPromiseNode local_160;
  PromiseBase local_158;
  HttpMethod local_14c;
  undefined8 *local_148;
  long local_140;
  OwnPromiseNode local_138;
  WeakFulfillerBase *local_130;
  WeakFulfiller<kj::HttpClient::Response> *local_128;
  PromiseArenaMember *in_stack_fffffffffffffee0;
  PromiseArenaMember *node_00;
  undefined8 *in_stack_fffffffffffffee8;
  long *in_stack_fffffffffffffef0;
  String local_108;
  SourceLocation local_e8;
  byte *local_d0;
  Request *local_c8;
  OwnPromiseNode local_c0;
  char *local_b8;
  char *pcStack_b0;
  undefined8 local_a8;
  HttpHeaders local_a0;
  Maybe<unsigned_long> local_40;
  char *pcVar11;
  
  pvVar13 = (void *)url.content.size_;
  pcVar11 = url.content.ptr;
  __arg = pvVar13;
  local_14c = method;
  heapString(&local_108,(long)pvVar13 - 1);
  __flags = (int)pcVar11;
  pvVar10 = extraout_RDX;
  if ((long)pvVar13 - 1U != 0) {
    pHVar12 = (HttpHeaders *)local_108.content.size_;
    if ((HttpHeaders *)local_108.content.size_ != (HttpHeaders *)0x0) {
      pHVar12 = (HttpHeaders *)local_108.content.ptr;
    }
    memcpy(pHVar12,url.content.ptr,(long)pvVar13 - 1U);
    pvVar10 = extraout_RDX_00;
  }
  HttpHeaders::clone(&local_a0,(__fn *)headers,pvVar10,__flags,__arg);
  heap<kj::HttpHeaders>((kj *)&local_148,&local_a0);
  HttpHeaders::~HttpHeaders(&local_a0);
  local_40.ptr.isSet = (expectedBodySize->ptr).isSet;
  if (local_40.ptr.isSet == true) {
    local_40.ptr.field_1 = (expectedBodySize->ptr).field_1;
  }
  newOneWayPipe((OneWayPipe *)&local_a0,&local_40);
  pWVar8 = (WeakFulfiller<kj::HttpClient::Response> *)operator_new(0x18);
  (pWVar8->super_WeakFulfillerBase).inner = (PromiseRejector *)0x0;
  (pWVar8->super_PromiseFulfiller<kj::HttpClient::Response>).super_PromiseRejector.
  _vptr_PromiseRejector = (_func_int **)&PTR_reject_006dc2c8;
  (pWVar8->super_WeakFulfillerBase).super_Disposer._vptr_Disposer =
       (_func_int **)&PTR_disposeImpl_006dc300;
  kj::_::PromiseDisposer::
  alloc<kj::_::AdapterPromiseNode<kj::HttpClient::Response,kj::_::PromiseAndFulfillerAdapter<kj::HttpClient::Response>>,kj::_::PromiseDisposer,kj::_::WeakFulfiller<kj::HttpClient::Response>&>
            ((PromiseDisposer *)&local_e8,pWVar8);
  local_138.ptr = (PromiseNode *)local_e8.fileName;
  local_130 = &pWVar8->super_WeakFulfillerBase;
  local_128 = pWVar8;
  pPVar9 = (PromiseArena *)operator_new(0x30);
  local_128 = (WeakFulfiller<kj::HttpClient::Response> *)0x0;
  local_d0 = pPVar9->bytes + 8;
  *(undefined ***)pPVar9->bytes = &PTR_send_006d9580;
  *(undefined ***)(pPVar9->bytes + 8) = &PTR_disposeImpl_006d95b0;
  *(HttpMethod *)(pPVar9->bytes + 0x14) = local_14c;
  *(WeakFulfillerBase **)(pPVar9->bytes + 0x18) = &pWVar8->super_WeakFulfillerBase;
  *(WeakFulfiller<kj::HttpClient::Response> **)(pPVar9->bytes + 0x20) = pWVar8;
  pPVar9->bytes[0x28] = '\0';
  pPVar9->bytes[0x29] = '\0';
  pPVar9->bytes[0x2a] = '\0';
  pPVar9->bytes[0x2b] = '\0';
  pPVar9->bytes[0x2c] = '\0';
  pPVar9->bytes[0x2d] = '\0';
  pPVar9->bytes[0x2e] = '\0';
  pPVar9->bytes[0x2f] = '\0';
  pPVar9->bytes[0x10] = '\x01';
  pPVar9->bytes[0x11] = '\0';
  pPVar9->bytes[0x12] = '\0';
  pPVar9->bytes[0x13] = '\0';
  local_b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  pcStack_b0 = "request";
  local_a8 = 0x1700001a3c;
  location.function = (char *)in_stack_fffffffffffffee8;
  location.fileName = (char *)in_stack_fffffffffffffee0;
  location._16_8_ = in_stack_fffffffffffffef0;
  newPromiseAndFulfiller<kj::Promise<void>>(location);
  node_00 = (PromiseArenaMember *)0x0;
  pPVar1 = in_stack_fffffffffffffee0->arena;
  local_160.ptr = (PromiseNode *)in_stack_fffffffffffffee0;
  local_c8 = __return_storage_ptr__;
  if (pPVar1 == (PromiseArena *)0x0 ||
      (ulong)((long)in_stack_fffffffffffffee0 - (long)pPVar1) < 0x30) {
    pvVar10 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar10 + 0x3d0);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_160,kj::_::IdentityFunc<void>::operator());
    *(undefined ***)((long)pvVar10 + 0x3d0) = &PTR_destroy_006d9a08;
    *(PromiseArena **)((long)pvVar10 + 0x3f8) = pPVar9;
    *(void **)((long)pvVar10 + 0x3d8) = pvVar10;
  }
  else {
    in_stack_fffffffffffffee0->arena = (PromiseArena *)0x0;
    this_00 = (TransformPromiseNodeBase *)(in_stack_fffffffffffffee0 + -3);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_160,kj::_::IdentityFunc<void>::operator());
    in_stack_fffffffffffffee0[-3]._vptr_PromiseArenaMember = (_func_int **)&PTR_destroy_006d9a08;
    in_stack_fffffffffffffee0[-1].arena = pPVar9;
    in_stack_fffffffffffffee0[-3].arena = pPVar1;
  }
  local_e8.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  local_e8.function = "setPromise";
  local_e8.lineNumber = 0x1ae2;
  local_e8.columnNumber = 0xe;
  local_c0.ptr = &this_00->super_PromiseNode;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::EagerPromiseNode<kj::_::Void>,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_158,&local_c0,&local_e8);
  OVar2.ptr = local_c0.ptr;
  PVar3.node.ptr = local_158.node.ptr;
  if ((TransformPromiseNodeBase *)local_c0.ptr != (TransformPromiseNodeBase *)0x0) {
    local_c0.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  node = *(PromiseArenaMember **)(pPVar9->bytes + 0x28);
  *(OwnPromiseNode *)(pPVar9->bytes + 0x28) = PVar3.node.ptr;
  if (node != (PromiseArenaMember *)0x0) {
    kj::_::PromiseDisposer::dispose(node);
  }
  OVar2.ptr = local_160.ptr;
  if (&(local_160.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_160.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  pRVar5 = local_c8;
  pHVar12 = (HttpHeaders *)local_108.content.ptr;
  if ((HttpHeaders *)local_108.content.size_ == (HttpHeaders *)0x0) {
    pHVar12 = (HttpHeaders *)0x524569;
  }
  (**this->service->_vptr_HttpService)
            (&local_e8,this->service,(ulong)local_14c,pHVar12,
             (char *)((long)(HttpHeaderTable **)local_108.content.size_ +
                     (ulong)((HttpHeaders *)local_108.content.size_ == (HttpHeaders *)0x0)),
             local_140,local_a0.indexedHeaders.ptr,pPVar9);
  Promise<void>::
  attach<kj::Own<kj::AsyncInputStream,decltype(nullptr)>,kj::String,kj::Own<kj::HttpHeaders,decltype(nullptr)>>
            ((Promise<void> *)&local_158,(Own<kj::AsyncInputStream,_std::nullptr_t> *)&local_e8,
             (String *)&local_a0,(Own<kj::HttpHeaders,_std::nullptr_t> *)&local_108);
  pcVar11 = local_e8.fileName;
  if ((PromiseArenaMember *)local_e8.fileName != (PromiseArenaMember *)0x0) {
    local_e8.fileName = (char *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pcVar11);
  }
  (**(code **)(*in_stack_fffffffffffffef0 + 0x10))(in_stack_fffffffffffffef0,&local_158);
  (pRVar5->body).disposer = (Disposer *)local_a0.indexedHeaders.size_;
  (pRVar5->body).ptr = (AsyncOutputStream *)local_a0.indexedHeaders.disposer;
  local_a0.indexedHeaders.disposer = (ArrayDisposer *)0x0;
  local_e8.fileName = (char *)local_d0;
  local_e8.function = (char *)pPVar9;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl,decltype(nullptr)>>,kj::_::PromiseDisposer,kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl,decltype(nullptr)>>
            ((PromiseDisposer *)&pRVar5->response,&local_138,
             (Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl,_std::nullptr_t> *)
             &local_e8);
  if ((PromiseArena *)local_e8.function != (PromiseArena *)0x0) {
    (*(code *)**(undefined8 **)local_e8.fileName)
              (local_e8.fileName,
               (byte *)local_e8.function + *(long *)(*(long *)(byte *)local_e8.function + -0x10));
  }
  PVar3.node.ptr = local_158.node.ptr;
  if (local_158.node.ptr != (PromiseNode *)0x0) {
    local_158.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)PVar3.node.ptr);
  }
  if (in_stack_fffffffffffffef0 != (long *)0x0) {
    (**(code **)*in_stack_fffffffffffffee8)
              (in_stack_fffffffffffffee8,
               (long)in_stack_fffffffffffffef0 + *(long *)(*in_stack_fffffffffffffef0 + -0x10));
  }
  if (node_00 != (PromiseArenaMember *)0x0) {
    kj::_::PromiseDisposer::dispose(node_00);
  }
  pWVar8 = local_128;
  if (local_128 != (WeakFulfiller<kj::HttpClient::Response> *)0x0) {
    local_128 = (WeakFulfiller<kj::HttpClient::Response> *)0x0;
    (**(local_130->super_Disposer)._vptr_Disposer)
              (local_130,(long)pWVar8 + *(long *)(*(long *)pWVar8 + -0x10));
  }
  OVar2.ptr = local_138.ptr;
  if (&(local_138.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_138.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  pAVar7 = local_a0.indexedHeaders.disposer;
  if (local_a0.indexedHeaders.disposer != (ArrayDisposer *)0x0) {
    local_a0.indexedHeaders.disposer = (ArrayDisposer *)0x0;
    (***(_func_int ***)local_a0.indexedHeaders.size_)
              (local_a0.indexedHeaders.size_,
               pAVar7->_vptr_ArrayDisposer[-2] + (long)&pAVar7->_vptr_ArrayDisposer);
  }
  pSVar6 = local_a0.indexedHeaders.ptr;
  if (local_a0.indexedHeaders.ptr != (StringPtr *)0x0) {
    local_a0.indexedHeaders.ptr = (StringPtr *)0x0;
    (*(code *)((((local_a0.table)->namesById).builder.ptr)->content).ptr)
              (local_a0.table,
               (long)&(pSVar6->content).ptr + *(long *)((pSVar6->content).ptr + -0x10));
  }
  if (local_140 != 0) {
    local_140 = 0;
    (**(code **)*local_148)();
  }
  sVar4 = local_108.content.size_;
  pcVar11 = local_108.content.ptr;
  if ((HttpHeaders *)local_108.content.ptr != (HttpHeaders *)0x0) {
    local_108.content.ptr = (char *)0x0;
    local_108.content.size_ = 0;
    (**(local_108.content.disposer)->_vptr_ArrayDisposer)
              (local_108.content.disposer,pcVar11,1,sVar4,sVar4,0);
  }
  return pRVar5;
}

Assistant:

Request request(HttpMethod method, kj::StringPtr url, const HttpHeaders& headers,
                  kj::Maybe<uint64_t> expectedBodySize = kj::none) override {
    // We have to clone the URL and headers because HttpService implementation are allowed to
    // assume that they remain valid until the service handler completes whereas HttpClient callers
    // are allowed to destroy them immediately after the call.
    auto urlCopy = kj::str(url);
    auto headersCopy = kj::heap(headers.clone());

    auto pipe = newOneWayPipe(expectedBodySize);

    // TODO(cleanup): The ownership relationships here are a mess. Can we do something better
    //   involving a PromiseAdapter, maybe?
    auto paf = kj::newPromiseAndFulfiller<Response>();
    auto responder = kj::refcounted<ResponseImpl>(method, kj::mv(paf.fulfiller));

    auto requestPaf = kj::newPromiseAndFulfiller<kj::Promise<void>>();
    responder->setPromise(kj::mv(requestPaf.promise));

    auto promise = service.request(method, urlCopy, *headersCopy, *pipe.in, *responder)
        .attach(kj::mv(pipe.in), kj::mv(urlCopy), kj::mv(headersCopy));
    requestPaf.fulfiller->fulfill(kj::mv(promise));

    return {
      kj::mv(pipe.out),
      paf.promise.attach(kj::mv(responder))
    };
  }